

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  uint uVar1;
  ImFontAtlasCustomRect *pIVar2;
  stbrp_rect *rects;
  long lVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  size_t __n;
  ImVector<stbrp_rect> pack_rects;
  
  uVar1 = (atlas->CustomRects).Size;
  if ((long)(int)uVar1 < 1) {
    rects = (stbrp_rect *)0x0;
  }
  else {
    uVar7 = 8;
    if (8 < uVar1) {
      uVar7 = (ulong)uVar1;
    }
    rects = (stbrp_rect *)ImGui::MemAlloc(uVar7 << 4);
  }
  __n = (long)(int)uVar1 * 0x10;
  memset(rects,0,__n);
  lVar3 = (long)(atlas->CustomRects).Size;
  if (0 < lVar3) {
    pIVar2 = (atlas->CustomRects).Data;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&rects->w + lVar5) = *(undefined4 *)(&pIVar2->Width + lVar5);
      lVar5 = lVar5 + 0x10;
    } while (lVar3 * 0x10 != lVar5);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,rects,uVar1);
  if ((int)uVar1 < 1) {
    if (rects == (stbrp_rect *)0x0) {
      return;
    }
  }
  else {
    sVar4 = 0;
    do {
      if (*(int *)((long)&rects->was_packed + sVar4) != 0) {
        uVar1 = *(uint *)((long)&rects->x + sVar4);
        *(uint *)(&((atlas->CustomRects).Data)->X + sVar4) = uVar1;
        iVar6 = (uint)*(ushort *)((long)&rects->h + sVar4) + (uVar1 >> 0x10);
        if (iVar6 < atlas->TexHeight) {
          iVar6 = atlas->TexHeight;
        }
        atlas->TexHeight = iVar6;
      }
      sVar4 = sVar4 + 0x10;
    } while (__n != sVar4);
  }
  ImGui::MemFree(rects);
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}